

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NitfIsd.h
# Opt level: O1

void __thiscall csm::Image::~Image(Image *this)

{
  std::vector<csm::Tre,_std::allocator<csm::Tre>_>::~vector
            ((vector<csm::Tre,_std::allocator<csm::Tre>_> *)(this + 0x20));
  if (*(Image **)this != this + 0x10) {
    operator_delete(*(Image **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

~Image() {}